

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_key_anchors_and_refs(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  csubstr s;
  bool bVar4;
  error_flags eVar5;
  size_t sVar6;
  Parser *in_RDI;
  csubstr anchor;
  char msg_1 [30];
  csubstr rem;
  char msg [31];
  Parser *in_stack_000002e0;
  csubstr in_stack_000002e8;
  flag_t in_stack_fffffffffffffe1c;
  Parser *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  char in_stack_fffffffffffffe47;
  basic_substring<const_char> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  basic_substring<char_const> local_160 [16];
  char *local_150;
  ulong local_148;
  LineContents *pLVar7;
  char *in_stack_fffffffffffffed8;
  ulong uVar8;
  char *pcVar9;
  Parser *in_stack_fffffffffffffee0;
  Parser *pPStack_118;
  undefined8 local_110;
  size_t in_stack_fffffffffffffef8;
  Parser *in_stack_ffffffffffffff00;
  char local_f8 [40];
  basic_substring<const_char> local_d0;
  undefined8 local_c0;
  Parser *pPStack_b8;
  size_t local_b0;
  size_t sStack_a8;
  char *local_a0;
  char local_98 [55];
  bool local_61;
  char *local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined1 *local_48;
  LineContents *local_40;
  char *local_38;
  char *local_30;
  undefined4 local_28;
  size_t local_20;
  basic_substring<const_char> *local_18;
  char *local_10;
  ulong local_8;
  
  bVar4 = has_any(in_RDI,0x80);
  if (bVar4) {
    builtin_strncpy(local_98,"check failed: (!has_any(RVAL))",0x1f);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                       in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                       ,(size_t)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe1c = (flag_t)((ulong)local_c0 >> 0x20);
    LVar2.super_LineCol.line = (size_t)pPStack_b8;
    LVar2.super_LineCol.offset = local_c0;
    LVar2.super_LineCol.col = local_b0;
    LVar2.name.str = (char *)sStack_a8;
    LVar2.name.len = (size_t)local_a0;
    (*p_Var1)(local_98,0x1f,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffe20 = pPStack_b8;
    in_stack_fffffffffffffe28 = local_b0;
    in_stack_fffffffffffffe30 = sStack_a8;
    in_stack_fffffffffffffe38 = local_a0;
  }
  local_d0.str = (in_RDI->m_state->line_contents).rem.str;
  local_d0.len = (in_RDI->m_state->line_contents).rem.len;
  bVar4 = basic_substring<const_char>::begins_with(&local_d0,'&');
  if (bVar4) {
    bVar4 = has_all(in_RDI,0x220);
    if (bVar4) {
      bVar4 = has_any(in_RDI,0x40);
      if (!bVar4) {
        builtin_strncpy(local_f8,"check failed: (has_any(RKEY))",0x1e);
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          trap_instruction();
        }
        p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40)
                           ,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
        in_stack_fffffffffffffe1c = (flag_t)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        LVar3.super_LineCol.line = (size_t)pPStack_118;
        LVar3.super_LineCol.offset = (size_t)in_stack_fffffffffffffee0;
        LVar3.super_LineCol.col = local_110;
        LVar3.name.str = (char *)in_stack_fffffffffffffef8;
        LVar3.name.len = (size_t)in_stack_ffffffffffffff00;
        (*p_Var1)(local_f8,0x1e,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffffe20 = pPStack_118;
      }
      _append_key_val_null(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      rem_flags(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      local_61 = true;
    }
    else {
      local_20 = basic_substring<const_char>::first_of
                           (in_stack_fffffffffffffe48,in_stack_fffffffffffffe47,
                            (size_t)in_stack_fffffffffffffe38);
      local_18 = &local_d0;
      if (local_d0.len < local_20 && local_20 != 0xffffffffffffffff) {
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) &&
           (in_stack_fffffffffffffe57 = is_debugger_attached(), (bool)in_stack_fffffffffffffe57)) {
          trap_instruction();
        }
        local_30 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_28 = 0x1569;
        handle_error(0x344e8b,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
      }
      if (local_20 == 0xffffffffffffffff) {
        local_10 = local_d0.str;
        local_8 = local_d0.len;
      }
      else {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      }
      uVar8 = local_8;
      _line_progressed(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_48 = &stack0xfffffffffffffed0;
      local_50 = 1;
      if (uVar8 == 0) {
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) &&
           (in_stack_fffffffffffffe47 = is_debugger_attached(), (bool)in_stack_fffffffffffffe47)) {
          trap_instruction();
        }
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x1533;
        handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      pLVar7 = local_40;
      pcVar9 = local_38;
      _move_key_anchor_to_val_anchor
                ((Parser *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      (in_RDI->m_key_anchor).str = (char *)pLVar7;
      (in_RDI->m_key_anchor).len = (size_t)pcVar9;
      local_150 = local_d0.str;
      local_148 = local_d0.len;
      s.len = (size_t)pLVar7;
      s.str = local_38;
      sVar6 = LineContents::current_col(local_40,s);
      in_RDI->m_key_anchor_indentation = sVar6;
      local_61 = true;
    }
  }
  else {
    bVar4 = basic_substring<const_char>::begins_with(&local_d0,'*');
    if (bVar4) {
      bVar4 = is_debugger_attached();
      if ((bVar4) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<65ul>
                (local_160,
                 (char (*) [65])"ERROR: not implemented - this should have been catched elsewhere");
      _err<>(in_stack_000002e0,in_stack_000002e8);
      eVar5 = get_error_flags();
      if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        trap_instruction();
      }
      handle_error(0x344e8b,(char *)0x719e,"never reach this point");
    }
    local_61 = false;
  }
  return local_61;
}

Assistant:

bool Parser::_handle_key_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RVAL));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        _c4dbgp("found a key anchor!!!");
        if(has_all(QMRK|SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
            _c4dbgp("there is a stored key, so this anchor is for the next element");
            _append_key_val_null(rem.str - 1);
            rem_flags(QMRK);
            return true;
        }
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _move_key_anchor_to_val_anchor();
        _c4dbgpf("key anchor value: '{}'", anchor);
        m_key_anchor = anchor;
        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}